

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

char * libssh2_session_hostkey(LIBSSH2_SESSION *session,size_t *len,int *type)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar *__s2;
  
  uVar1 = session->server_hostkey_len;
  if ((ulong)uVar1 == 0) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    __s2 = (uchar *)0x0;
  }
  else {
    if (len != (size_t *)0x0) {
      *len = (ulong)uVar1;
    }
    __s2 = session->server_hostkey;
    if (type != (int *)0x0) {
      iVar3 = 0;
      if (10 < uVar1) {
        iVar2 = bcmp(hostkey_type_rsa,__s2,0xb);
        if (iVar2 == 0) {
          iVar3 = 1;
        }
        else {
          iVar2 = bcmp(&hostkey_type_dss,__s2,0xb);
          if (iVar2 == 0) {
            iVar3 = 2;
          }
          else if (0xe < uVar1) {
            iVar2 = bcmp("",__s2,0xf);
            if (iVar2 == 0) {
              iVar3 = 6;
            }
            else if (0x16 < uVar1) {
              iVar3 = bcmp(&hostkey_type_ecdsa_256,__s2,0x17);
              if (iVar3 == 0) {
                iVar3 = 3;
              }
              else {
                iVar3 = bcmp(&hostkey_type_ecdsa_384,__s2,0x17);
                if (iVar3 == 0) {
                  iVar3 = 4;
                }
                else {
                  iVar3 = bcmp(&hostkey_type_ecdsa_521,__s2,0x17);
                  iVar3 = (uint)(iVar3 == 0) * 5;
                }
              }
            }
          }
        }
      }
      *type = iVar3;
    }
  }
  return (char *)__s2;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_hostkey(LIBSSH2_SESSION *session, size_t *len, int *type)
{
    if(session->server_hostkey_len) {
        if(len)
            *len = session->server_hostkey_len;
        if(type)
            *type = hostkey_type(session->server_hostkey,
                                 session->server_hostkey_len);
        return (char *) session->server_hostkey;
    }
    if(len)
        *len = 0;
    return NULL;
}